

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p.c
# Opt level: O0

int envy_bios_parse_p_falcon_ucode(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  envy_bios_p_falcon_ucode *peVar18;
  envy_bios_p_falcon_ucode_entry *peVar19;
  uint32_t suboffset;
  uint32_t data;
  int err;
  int i;
  envy_bios_p_falcon_ucode *falcon_ucode;
  envy_bios *bios_local;
  
  peVar18 = &(bios->p).falcon_ucode;
  if (peVar18->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,(uint)peVar18->offset,&(bios->p).falcon_ucode.version);
    if ((bios->p).falcon_ucode.version == '\x01') {
      iVar1 = bios_u8(bios,peVar18->offset + 1,&(bios->p).falcon_ucode.hlen);
      iVar2 = bios_u8(bios,peVar18->offset + 2,&(bios->p).falcon_ucode.rlen);
      iVar3 = bios_u8(bios,peVar18->offset + 3,&(bios->p).falcon_ucode.entriesnum);
      iVar4 = bios_u8(bios,peVar18->offset + 4,&(bios->p).falcon_ucode.desc_version);
      iVar5 = bios_u8(bios,peVar18->offset + 5,&(bios->p).falcon_ucode.desc_size);
      (bios->p).falcon_ucode.valid =
           ((iVar5 != 0 || (iVar4 != 0 || (iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)))) ^ 0xffU) & 1;
      suboffset = 0;
      peVar19 = (envy_bios_p_falcon_ucode_entry *)
                malloc((ulong)(bios->p).falcon_ucode.entriesnum << 6);
      (bios->p).falcon_ucode.entries = peVar19;
      for (data = 0; (int)data < (int)(uint)(bios->p).falcon_ucode.entriesnum; data = data + 1) {
        uVar6 = (uint)peVar18->offset + (uint)(bios->p).falcon_ucode.hlen +
                data * (bios->p).falcon_ucode.rlen;
        (bios->p).falcon_ucode.entries[(int)data].offset = (uint16_t)uVar6;
        uVar7 = bios_u8(bios,uVar6,&(bios->p).falcon_ucode.entries[(int)data].application_id);
        uVar8 = bios_u8(bios,uVar6 + 1,&(bios->p).falcon_ucode.entries[(int)data].target_id);
        uVar6 = bios_u32(bios,uVar6 + 2,&(bios->p).falcon_ucode.entries[(int)data].desc_ptr);
        suboffset = uVar6 | uVar8 | uVar7 | suboffset;
        if ((bios->p).falcon_ucode.entries[(int)data].desc_ptr != 0) {
          uVar6 = (bios->p).falcon_ucode.entries[(int)data].desc_ptr;
          (bios->p).falcon_ucode.entries[(int)data].desc.offset = uVar6;
          uVar7 = bios_u32(bios,uVar6,&(bios->p).falcon_ucode.entries[(int)data].desc.stored_size);
          uVar8 = bios_u32(bios,uVar6 + 4,
                           &(bios->p).falcon_ucode.entries[(int)data].desc.uncompressed_size);
          uVar9 = bios_u32(bios,uVar6 + 8,
                           &(bios->p).falcon_ucode.entries[(int)data].desc.virtual_entry);
          uVar10 = bios_u32(bios,uVar6 + 0xc,
                            &(bios->p).falcon_ucode.entries[(int)data].desc.interface_offset);
          uVar11 = bios_u32(bios,uVar6 + 0x10,
                            &(bios->p).falcon_ucode.entries[(int)data].desc.imem_phys_base);
          uVar12 = bios_u32(bios,uVar6 + 0x14,
                            &(bios->p).falcon_ucode.entries[(int)data].desc.imem_load_size);
          uVar13 = bios_u32(bios,uVar6 + 0x18,
                            &(bios->p).falcon_ucode.entries[(int)data].desc.imem_virt_base);
          uVar14 = bios_u32(bios,uVar6 + 0x1c,
                            &(bios->p).falcon_ucode.entries[(int)data].desc.imem_sec_base);
          uVar15 = bios_u32(bios,uVar6 + 0x20,
                            &(bios->p).falcon_ucode.entries[(int)data].desc.imem_sec_size);
          uVar16 = bios_u32(bios,uVar6 + 0x24,
                            &(bios->p).falcon_ucode.entries[(int)data].desc.dmem_offset);
          uVar17 = bios_u32(bios,uVar6 + 0x28,
                            &(bios->p).falcon_ucode.entries[(int)data].desc.dmem_phys_base);
          uVar6 = bios_u32(bios,uVar6 + 0x2c,
                           &(bios->p).falcon_ucode.entries[(int)data].desc.dmem_load_size);
          suboffset = uVar6 | uVar17 | uVar16 | uVar15 | uVar14 | uVar13 | uVar12 | uVar11 | uVar10 
                                                  | uVar9 | uVar8 | uVar7 | suboffset;
          (bios->p).falcon_ucode.entries[(int)data].desc.valid = (suboffset != 0 ^ 0xffU) & 1;
        }
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown FALCON UCODE table version 0x%x\n",
              (ulong)(bios->p).falcon_ucode.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int
envy_bios_parse_p_falcon_ucode(struct envy_bios *bios)
{
	struct envy_bios_p_falcon_ucode *falcon_ucode = &bios->p.falcon_ucode;
	int i, err = 0;

	if (!falcon_ucode->offset)
		return -EINVAL;

	bios_u8(bios, falcon_ucode->offset + 0x0, &falcon_ucode->version);
	switch(falcon_ucode->version) {
	case 0x1:
		err |= bios_u8(bios, falcon_ucode->offset + 0x1, &falcon_ucode->hlen);
		err |= bios_u8(bios, falcon_ucode->offset + 0x2, &falcon_ucode->rlen);
		err |= bios_u8(bios, falcon_ucode->offset + 0x3, &falcon_ucode->entriesnum);

		err |= bios_u8(bios, falcon_ucode->offset + 0x4, &falcon_ucode->desc_version);
		err |= bios_u8(bios, falcon_ucode->offset + 0x5, &falcon_ucode->desc_size);
		falcon_ucode->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FALCON UCODE table version 0x%x\n", falcon_ucode->version);
		return -EINVAL;
	};

	err = 0;
	falcon_ucode->entries = malloc(falcon_ucode->entriesnum * sizeof(struct envy_bios_p_falcon_ucode_entry));
	for (i = 0; i < falcon_ucode->entriesnum; i++) {
		uint32_t data = falcon_ucode->offset + falcon_ucode->hlen + i * falcon_ucode->rlen;

		falcon_ucode->entries[i].offset = data;
		err |= bios_u8(bios, data + 0x0, &falcon_ucode->entries[i].application_id);
		err |= bios_u8(bios, data + 0x1, &falcon_ucode->entries[i].target_id);
		err |= bios_u32(bios, data + 0x2, &falcon_ucode->entries[i].desc_ptr);

		if (falcon_ucode->entries[i].desc_ptr) {
			uint32_t suboffset = falcon_ucode->entries[i].desc_ptr;

			falcon_ucode->entries[i].desc.offset = suboffset;
			err |= bios_u32(bios, suboffset + 0x0, &falcon_ucode->entries[i].desc.stored_size);
			err |= bios_u32(bios, suboffset + 0x4, &falcon_ucode->entries[i].desc.uncompressed_size);
			err |= bios_u32(bios, suboffset + 0x8, &falcon_ucode->entries[i].desc.virtual_entry);
			err |= bios_u32(bios, suboffset + 0xc, &falcon_ucode->entries[i].desc.interface_offset);
			err |= bios_u32(bios, suboffset + 0x10, &falcon_ucode->entries[i].desc.imem_phys_base);
			err |= bios_u32(bios, suboffset + 0x14, &falcon_ucode->entries[i].desc.imem_load_size);
			err |= bios_u32(bios, suboffset + 0x18, &falcon_ucode->entries[i].desc.imem_virt_base);
			err |= bios_u32(bios, suboffset + 0x1c, &falcon_ucode->entries[i].desc.imem_sec_base);
			err |= bios_u32(bios, suboffset + 0x20, &falcon_ucode->entries[i].desc.imem_sec_size);
			err |= bios_u32(bios, suboffset + 0x24, &falcon_ucode->entries[i].desc.dmem_offset);
			err |= bios_u32(bios, suboffset + 0x28, &falcon_ucode->entries[i].desc.dmem_phys_base);
			err |= bios_u32(bios, suboffset + 0x2c, &falcon_ucode->entries[i].desc.dmem_load_size);
			falcon_ucode->entries[i].desc.valid = !err;
		}
	}

	return 0;
}